

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O3

int TIFFUnsetField(TIFF *tif,uint32_t tag)

{
  undefined8 *puVar1;
  uint32_t *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  TIFFTagValue *pTVar5;
  byte bVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  TIFFField *pTVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  pTVar10 = TIFFFieldWithTag(tif,tag);
  if (pTVar10 == (TIFFField *)0x0) {
    iVar9 = 0;
  }
  else {
    uVar4 = pTVar10->field_bit;
    if (uVar4 == 0x41) {
      lVar11 = (long)(tif->tif_dir).td_customValueCount;
      if (0 < lVar11) {
        pTVar5 = (tif->tif_dir).td_customValues;
        lVar13 = 0x10;
        lVar14 = 0;
LAB_0028a3f0:
        if (**(uint32_t **)((long)pTVar5 + lVar13 + -0x10) != tag) goto code_r0x0028a3f9;
        _TIFFfreeExt(tif,*(void **)((long)&pTVar5->info + lVar13));
        uVar8 = (tif->tif_dir).td_customValueCount - 1;
        uVar12 = (ulong)uVar8;
        if ((int)lVar14 < (int)uVar8) {
          lVar13 = lVar13 + -0x10;
          do {
            pTVar5 = (tif->tif_dir).td_customValues;
            lVar14 = lVar14 + 1;
            *(undefined8 *)((long)&pTVar5->value + lVar13) =
                 *(undefined8 *)((long)&pTVar5[1].value + lVar13);
            puVar3 = (undefined8 *)((long)&pTVar5[1].info + lVar13);
            uVar7 = puVar3[1];
            puVar1 = (undefined8 *)((long)&pTVar5->info + lVar13);
            *puVar1 = *puVar3;
            puVar1[1] = uVar7;
            uVar12 = (long)(tif->tif_dir).td_customValueCount - 1;
            lVar13 = lVar13 + 0x18;
          } while (lVar14 < (long)uVar12);
        }
        (tif->tif_dir).td_customValueCount = (int)uVar12;
      }
    }
    else {
      bVar6 = (byte)uVar4 & 0x1f;
      puVar2 = (tif->tif_dir).td_fieldsset + (uVar4 >> 5);
      *puVar2 = *puVar2 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
    }
LAB_0028a470:
    *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 8;
    iVar9 = 1;
  }
  return iVar9;
code_r0x0028a3f9:
  lVar14 = lVar14 + 1;
  lVar13 = lVar13 + 0x18;
  if (lVar11 == lVar14) goto LAB_0028a470;
  goto LAB_0028a3f0;
}

Assistant:

int TIFFUnsetField(TIFF *tif, uint32_t tag)
{
    const TIFFField *fip = TIFFFieldWithTag(tif, tag);
    TIFFDirectory *td = &tif->tif_dir;

    if (!fip)
        return 0;

    if (fip->field_bit != FIELD_CUSTOM)
        TIFFClrFieldBit(tif, fip->field_bit);
    else
    {
        TIFFTagValue *tv = NULL;
        int i;

        for (i = 0; i < td->td_customValueCount; i++)
        {

            tv = td->td_customValues + i;
            if (tv->info->field_tag == tag)
                break;
        }

        if (i < td->td_customValueCount)
        {
            _TIFFfreeExt(tif, tv->value);
            for (; i < td->td_customValueCount - 1; i++)
            {
                td->td_customValues[i] = td->td_customValues[i + 1];
            }
            td->td_customValueCount--;
        }
    }

    tif->tif_flags |= TIFF_DIRTYDIRECT;

    return (1);
}